

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_qp.c
# Opt level: O2

void validate_qp(char *file_src,char *file_tmp,char *file_res,int mode,int rm_tmp_file)

{
  int iVar1;
  FILE *pFVar2;
  char *pcVar3;
  undefined8 uVar4;
  char *pcVar5;
  char *pcVar6;
  char local_158 [8];
  char line [250];
  undefined2 local_40;
  undefined1 local_3e;
  int local_3c;
  char lt [3];
  char *fname;
  
  local_3e = 0;
  local_40 = 0xa0d;
  _lt = (char *)0x0;
  pcVar5 = (char *)0x0;
  local_3c = rm_tmp_file;
  asprintf((char **)lt,"%s/%s","samples",file_src);
  pFVar2 = fopen(_lt,"r");
  while( true ) {
    pcVar3 = fgets(local_158,0xfa,pFVar2);
    if (pcVar3 == (char *)0x0) break;
    uVar4 = cmime_string_chomp(local_158);
    if (mode == 1) {
      pcVar5 = (char *)cmime_qp_encode(uVar4,&local_40);
    }
    else {
      pcVar5 = (char *)cmime_qp_decode_text(uVar4);
    }
  }
  fclose(pFVar2);
  free(_lt);
  asprintf((char **)lt,"%s/%s","samples",file_tmp);
  pFVar2 = fopen(_lt,"w");
  if (pFVar2 != (FILE *)0x0) {
    fputs(pcVar5,pFVar2);
    fclose(pFVar2);
  }
  free(pcVar5);
  pFVar2 = fopen(_lt,"r");
  pcVar5 = (char *)0x0;
  while( true ) {
    pcVar3 = fgets(local_158,0xfa,pFVar2);
    if (pcVar3 == (char *)0x0) break;
    pcVar5 = (char *)cmime_string_chomp(local_158);
  }
  fclose(pFVar2);
  if (local_3c == 1) {
    remove(_lt);
  }
  free(_lt);
  pcVar3 = (char *)0x0;
  asprintf((char **)lt,"%s/%s","samples",file_res);
  pFVar2 = fopen(_lt,"r");
  while( true ) {
    pcVar6 = fgets(local_158,0xfa,pFVar2);
    if (pcVar6 == (char *)0x0) break;
    pcVar3 = (char *)cmime_string_chomp(local_158);
  }
  fclose(pFVar2);
  free(_lt);
  iVar1 = strcmp(pcVar5,pcVar3);
  if (iVar1 == 0) {
    return;
  }
  __assert_fail("strcmp(so,res)==0",
                "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/test/test_qp.c"
                ,0x5b,"void validate_qp(char *, char *, char *, int, int)");
}

Assistant:

void validate_qp(char *file_src, char *file_tmp, char *file_res, int mode, int rm_tmp_file) {
    
    char line[250];
    char lt[]="\r\n";
    FILE *f1 = NULL;
    FILE *f1_out = NULL;
    FILE *f1_out_in = NULL;
    FILE *f2 = NULL;
    char *fname = NULL;
    char *si = NULL; 
    char *so = NULL;
    char *res = NULL;

    asprintf(&fname,"%s/%s",SAMPLES_DIR,file_src);
    f1 = fopen(fname, "r");
    while(fgets(line, 250, f1)) {
        char *clean;
        clean = cmime_string_chomp(line);
        if(mode == 1) {
            si = cmime_qp_encode(clean, lt);
        } else {
            si = cmime_qp_decode_text(clean);
        }
    }
    fclose(f1);
    free(fname);
    // write the encoded string to the temporary output file
    asprintf(&fname,"%s/%s",SAMPLES_DIR,file_tmp);
    f1_out = fopen (fname, "w");
    if (f1_out != NULL) { 
        fprintf(f1_out,"%s",si);
        fclose(f1_out);
    }
    free(si);
    // read it out again
    f1_out_in = fopen(fname, "r");
    while(fgets(line, 250, f1_out_in)) {
        so = cmime_string_chomp(line);
    }
    fclose(f1_out_in);
    if(rm_tmp_file == 1) remove(fname);
    free(fname);
    // now open the file that contains the result string
    asprintf(&fname,"%s/%s",SAMPLES_DIR,file_res);
    f2 = fopen(fname, "r");
    while(fgets(line, 250, f2)) {
        res = cmime_string_chomp(line);
    }
    fclose(f2);
    free(fname);
    // comparison
    assert(strcmp(so,res)==0);
}